

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.hpp
# Opt level: O1

size_type trial::dynamic::key::count<std::allocator<char>,char16_t[8]>
                    (basic_variable<std::allocator<char>_> *self,char16_t (*other) [8])

{
  bool bVar1;
  value vVar2;
  const_reference lhs;
  size_type sVar3;
  key_iterator it;
  undefined1 auStack_d8 [32];
  type local_b8;
  index_type local_98;
  undefined1 local_88 [32];
  type local_68;
  index_type local_48;
  
  vVar2 = basic_variable<std::allocator<char>_>::symbol(self);
  if (vVar2 - boolean < 7) {
    bVar1 = detail::
            operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char16_t[8],_void>
            ::equal(self,*other);
    sVar3 = (size_type)bVar1;
  }
  else if (vVar2 - array < 2) {
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     *)local_88,self,true);
    local_48 = '\x06';
    local_68._0_4_ = 0;
    sVar3 = 0;
    while( true ) {
      basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       *)auStack_d8,self,false);
      local_98 = '\x06';
      local_b8._0_4_ = 0;
      bVar1 = basic_variable<std::allocator<char>_>::
              iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                        *)local_88,(key_iterator *)auStack_d8);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                  *)&local_b8.__align);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                  *)(auStack_d8 + 8));
      if (bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::key_iterator::key((key_iterator *)local_88);
      bVar1 = detail::
              operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char16_t[8],_void>
              ::equal(lhs,*other);
      sVar3 = sVar3 + bVar1;
      basic_variable<std::allocator<char>_>::key_iterator::operator++((key_iterator *)local_88);
    }
    detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                *)&local_68.__align);
    detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                *)(local_88 + 8));
  }
  else {
    sVar3 = (size_type)vVar2;
  }
  return sVar3;
}

Assistant:

auto count(const basic_variable<Allocator>& self,
           const T& other) -> typename basic_variable<Allocator>::size_type
{
    switch (self.symbol())
    {
    case symbol::null:
        return 0;

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? 1 : 0;

    case symbol::array:
    case symbol::map:
        {
            typename basic_variable<Allocator>::size_type result = 0;
            for (auto it = self.key_begin(); it != self.key_end(); ++it)
            {
                if (*it == other)
                    ++result;
            }
            return result;
        }
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}